

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.h
# Opt level: O0

String * __thiscall
kj::
str<kj::String&,char_const(&)[2],unsigned_int,char_const(&)[2],unsigned_int,char_const(&)[2],unsigned_int,char_const(&)[10],kj::StringPtr&,char_const(&)[2]>
          (String *__return_storage_ptr__,kj *this,String *params,char (*params_1) [2],
          uint *params_2,char (*params_3) [2],uint *params_4,char (*params_5) [2],uint *params_6,
          char (*params_7) [10],StringPtr *params_8,char (*params_9) [2])

{
  String *value;
  char (*pacVar1) [2];
  uint *puVar2;
  char (*value_00) [10];
  StringPtr *value_01;
  String *params_9_00;
  ArrayPtr<const_char> local_100;
  ArrayPtr<const_char> local_f0;
  ArrayPtr<const_char> local_e0;
  CappedArray<char,_14UL> local_d0;
  ArrayPtr<const_char> local_b8;
  CappedArray<char,_14UL> local_a8;
  ArrayPtr<const_char> local_90;
  CappedArray<char,_14UL> local_80;
  ArrayPtr<const_char> local_68;
  ArrayPtr<const_char> local_58;
  char (*local_48) [2];
  uint *params_local_4;
  char (*params_local_3) [2];
  uint *params_local_2;
  char (*params_local_1) [2];
  String *params_local;
  
  params_9_00 = __return_storage_ptr__;
  local_48 = params_3;
  params_local_4 = params_2;
  params_local_3 = params_1;
  params_local_2 = (uint *)params;
  params_local_1 = (char (*) [2])this;
  params_local = __return_storage_ptr__;
  value = fwd<kj::String&>((String *)this);
  local_58 = toCharSequence<kj::String&>(value);
  pacVar1 = ::const((char (*) [2])params_local_2);
  local_68 = toCharSequence<char_const(&)[2]>(pacVar1);
  puVar2 = fwd<unsigned_int>((NoInfer<unsigned_int> *)params_local_3);
  toCharSequence<unsigned_int>(&local_80,puVar2);
  pacVar1 = ::const((char (*) [2])params_local_4);
  local_90 = toCharSequence<char_const(&)[2]>(pacVar1);
  puVar2 = fwd<unsigned_int>((NoInfer<unsigned_int> *)local_48);
  toCharSequence<unsigned_int>(&local_a8,puVar2);
  pacVar1 = ::const((char (*) [2])params_4);
  local_b8 = toCharSequence<char_const(&)[2]>(pacVar1);
  puVar2 = fwd<unsigned_int>((NoInfer<unsigned_int> *)params_5);
  toCharSequence<unsigned_int>(&local_d0,puVar2);
  value_00 = ::const((char (*) [10])params_6);
  local_e0 = toCharSequence<char_const(&)[10]>(value_00);
  value_01 = fwd<kj::StringPtr&>((StringPtr *)params_7);
  local_f0 = toCharSequence<kj::StringPtr&>(value_01);
  pacVar1 = ::const((char (*) [2])params_8);
  local_100 = toCharSequence<char_const(&)[2]>(pacVar1);
  _::
  concat<kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::CappedArray<char,14ul>,kj::ArrayPtr<char_const>,kj::CappedArray<char,14ul>,kj::ArrayPtr<char_const>,kj::CappedArray<char,14ul>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>>
            (params_9_00,(_ *)&local_58,&local_68,(ArrayPtr<const_char> *)&local_80,
             (CappedArray<char,_14UL> *)&local_90,(ArrayPtr<const_char> *)&local_a8,
             (CappedArray<char,_14UL> *)&local_b8,(ArrayPtr<const_char> *)&local_d0,
             (CappedArray<char,_14UL> *)&local_e0,&local_f0,&local_100,
             (ArrayPtr<const_char> *)params_9_00);
  return __return_storage_ptr__;
}

Assistant:

String str(Params&&... params) {
  // Magic function which builds a string from a bunch of arbitrary values.  Example:
  //     str(1, " / ", 2, " = ", 0.5)
  // returns:
  //     "1 / 2 = 0.5"
  // To teach `str` how to stringify a type, see `Stringifier`.

  return _::concat(toCharSequence(kj::fwd<Params>(params))...);
}